

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
          (xr_reader *this,size_type n,
          vector<xray_re::way_link,_std::allocator<xray_re::way_link>_> *container)

{
  bool bVar1;
  way_link_io local_31;
  way_link local_30;
  
  std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::reserve(container,n);
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    local_30.from = 0;
    local_30.to = 0;
    local_30.weight = 0.0;
    std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::
    emplace_back<xray_re::way_link>(container,&local_30);
    way_link_io::operator()
              (&local_31,
               (container->super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}